

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Parser::ParseScript(Parser *this)

{
  bool bVar1;
  byte local_21;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_18;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  ParseLibraryImports(this);
  ParseLibraryDeclaration(this);
  while( true ) {
    local_18._M_current =
         (Symbol *)
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    bVar1 = __gnu_cxx::operator!=(&this->m_currentSymbol,&local_18);
    local_21 = 0;
    if (bVar1) {
      local_21 = this->m_error ^ 0xff;
    }
    if ((local_21 & 1) == 0) break;
    ParseStatement(this);
  }
  if (this->m_breakAddress != 0) {
    Error<>(this,"Illegal break");
  }
  EmitOpcode(this,Exit);
  WriteBytecodeHeader(this);
  bVar1 = EnableDebugInfo();
  if (bVar1) {
    WriteDebugInfo(this);
  }
  return;
}

Assistant:

inline_t void Parser::ParseScript()
	{
		ParseLibraryImports();
		ParseLibraryDeclaration();
		while (m_currentSymbol != m_symbolList.end() && !m_error)
			ParseStatement();
		if (m_breakAddress)
			Error("Illegal break");
		EmitOpcode(Opcode::Exit);
		WriteBytecodeHeader();
		if (EnableDebugInfo())
			WriteDebugInfo();
	}